

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVsubmit_encoded
               (CManager_conflict cm,EVstone stone,void *data,size_t data_len,attr_list attrs)

{
  int iVar1;
  event_path_data evp_00;
  stone_type p_Var2;
  undefined8 uVar3;
  attr_list p_Var4;
  CManager_conflict in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  CManager in_RDI;
  undefined8 in_R8;
  event_item *event;
  event_path_data evp;
  CManager_conflict in_stack_000000b0;
  event_path_data evp_01;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = (int)((ulong)in_R8 >> 0x20);
  evp_01 = in_RDI->evp;
  evp_00 = (event_path_data)get_free_event(evp_01);
  p_Var2 = stone_struct(evp_00,0);
  if (p_Var2 != (stone_type)0x0) {
    *(undefined4 *)&evp_00->stone_map = 0;
    evp_00->stone_base_num = 1;
    *(char **)&evp_00->stone_lookup_table_size = in_RDX;
    evp_00->ffsc = (FFSContext)in_RDI;
    evp_00->stone_lookup_table = (lookup_table_elem *)in_RCX;
    uVar3 = FFSTypeHandle_from_encode(evp_01->ffsc,in_RDX);
    uVar3 = FMFormat_of_original(uVar3);
    *(undefined8 *)&evp_00->source_count = uVar3;
    p_Var4 = CMint_add_ref_attr_list
                       (in_RDI,(attr_list)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                        (int)((ulong)in_RCX >> 0x20));
    evp_00->fmc = (FMContext)p_Var4;
    internal_path_submit(in_RCX,iVar1,(event_item *)evp_01);
    do {
      iVar1 = process_local_actions(in_stack_000000b0);
    } while (iVar1 != 0);
    return_event((event_path_data)attrs,(event_item *)evp);
  }
  return;
}

Assistant:

void
INT_EVsubmit_encoded(CManager cm, EVstone stone, void *data, size_t data_len, attr_list attrs)
{
    event_path_data evp = cm->evp;
    event_item *event = get_free_event(evp);
    if (stone_struct(evp, stone) == NULL) return;

    event->contents = Event_App_Owned;
    event->event_encoded = 1;
    event->encoded_event = data;
    event->cm = cm;
    event->event_len = data_len;
    event->reference_format = FMFormat_of_original(FFSTypeHandle_from_encode(evp->ffsc, 
							data));

    event->attrs = CMadd_ref_attr_list(cm, attrs);
    internal_path_submit(cm, stone, event);
    while (process_local_actions(cm));
    return_event(cm->evp, event);
}